

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

void Au_NtkTerSimulate_rec(Au_Ntk_t *p)

{
  void *pvVar1;
  Au_Ntk_t *p_00;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong *puVar12;
  long lVar13;
  long lVar14;
  ulong *puVar15;
  
  if (0 < (p->vPis).nSize) {
    iVar2 = (p->vPis).nSize;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    if (iVar2 != 0) {
      uVar7 = *(p->vPis).pArray;
      (*(code *)(&DAT_00a5ed1c +
                *(int *)(&DAT_00a5ed1c +
                        (ulong)(*(uint *)((long)(p->vPages).pArray[(int)uVar7 >> 0xc] +
                                         (ulong)((uVar7 & 0xfff) << 4)) >> 0x1e) * 4)))
                (0x3ff0000000000000,
                 &DAT_00a5ed1c +
                 *(int *)(&DAT_00a5ed1c +
                         (ulong)(*(uint *)((long)(p->vPages).pArray[(int)uVar7 >> 0xc] +
                                          (ulong)((uVar7 & 0xfff) << 4)) >> 0x1e) * 4));
      return;
    }
LAB_00865174:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar2 = strcmp(p->pName,"ref_egcd");
  if (iVar2 == 0) {
    printf("Replacing one instance of recursive model \"%s\" by a black box.\n","ref_egcd");
    if (0 < (p->vPos).nSize) {
      lVar14 = 0;
      do {
        if ((p->vPos).nSize <= lVar14) goto LAB_00865174;
        uVar7 = (p->vPos).pArray[lVar14];
        puVar15 = (ulong *)((long)(p->vPages).pArray[(int)uVar7 >> 0xc] +
                           (ulong)((uVar7 & 0xfff) << 4));
        *puVar15 = *puVar15 | 0xc0000000;
        lVar14 = lVar14 + 1;
      } while (lVar14 < (p->vPos).nSize);
    }
  }
  else {
    if ((p->vObjs).nSize < 1) {
      puVar15 = (ulong *)0x0;
    }
    else {
      lVar14 = 0;
      do {
        if ((p->vObjs).nSize <= lVar14) goto LAB_00865174;
        uVar7 = (p->vObjs).pArray[lVar14];
        pvVar1 = (p->vPages).pArray[(int)uVar7 >> 0xc];
        uVar4 = (ulong)((uVar7 & 0xfff) << 4);
        puVar15 = (ulong *)((long)pvVar1 + uVar4);
        uVar4 = *(ulong *)((long)pvVar1 + uVar4);
        uVar8 = uVar4 & 0x700000000;
        uVar6 = (uint)uVar4;
        uVar7 = (uint)(uVar4 >> 0x20);
        if (uVar8 == 0x700000000) {
          uVar6 = uVar6 & 0x3fffffff;
          if (uVar6 == 3) {
            if ((uVar4 < 0x800000000) || (uVar6 = (uint)puVar15[1], uVar6 == 0)) goto LAB_00865193;
            lVar13 = *(long *)(*(long *)((ulong)puVar15 & 0xfffffffffffffc00) + 0x78);
            uVar10 = *(uint *)(*(long *)(lVar13 + (long)((int)uVar6 >> 0xd) * 8) +
                              (ulong)(uVar6 & 0x1ffe) * 8) >> 0x1e;
            if ((uVar6 & 1) != 0) {
              (*(code *)(&DAT_00a5ed2c + *(int *)(&DAT_00a5ed2c + (ulong)uVar10 * 4)))
                        (&DAT_00a5ed2c,&DAT_00a5ed2c + *(int *)(&DAT_00a5ed2c + (ulong)uVar10 * 4));
              return;
            }
            if ((uVar4 < 0x1000000000) || (uVar6 = *(uint *)((long)puVar15 + 0xc), uVar6 == 0))
            goto LAB_00865193;
            uVar11 = *(uint *)(*(long *)(lVar13 + (long)((int)uVar6 >> 0xd) * 8) +
                              (ulong)(uVar6 & 0x1ffe) * 8) >> 0x1e;
            if ((uVar6 & 1) != 0) {
              (*(code *)(&DAT_00a5ed3c + *(int *)(&DAT_00a5ed3c + (ulong)uVar11 * 4)))
                        (&DAT_00a5ed3c + *(int *)(&DAT_00a5ed3c + (ulong)uVar11 * 4));
              return;
            }
            if ((uVar7 >> 3 < 3) || (uVar7 = (uint)puVar15[2], uVar7 == 0)) goto LAB_00865193;
            uVar6 = *(uint *)(*(long *)(lVar13 + (long)((int)uVar7 >> 0xd) * 8) +
                             (ulong)(uVar7 & 0x1ffe) * 8) >> 0x1e;
            if ((uVar7 & 1) != 0) {
              (*(code *)(&DAT_00a5ed4c + *(int *)(&DAT_00a5ed4c + (ulong)uVar6 * 4)))
                        (&DAT_00a5ed4c + *(int *)(&DAT_00a5ed4c + (ulong)uVar6 * 4));
              return;
            }
            uVar7 = uVar6;
            if (((uVar10 != 1) && (uVar7 = uVar11, uVar10 != 2)) &&
               ((uVar11 != 1 || (uVar7 = 1, uVar6 != 1)))) {
              uVar7 = (uVar11 == 2 && uVar6 == 2) ^ 3;
            }
            uVar8 = uVar4 & 0xffffffff3fffffff | (ulong)(uVar7 << 0x1e);
          }
          else {
            if (uVar6 == 2) {
              if ((uVar4 < 0x800000000) || (uVar7 = (uint)puVar15[1], uVar7 == 0))
              goto LAB_00865193;
              lVar13 = *(long *)(*(long *)((ulong)puVar15 & 0xfffffffffffffc00) + 0x78);
              uVar6 = *(uint *)(*(long *)(lVar13 + (long)((int)uVar7 >> 0xd) * 8) +
                               (ulong)(uVar7 & 0x1ffe) * 8) >> 0x1e;
              if ((uVar7 & 1) != 0) {
                (*(code *)(&DAT_00a5ed5c + *(int *)(&DAT_00a5ed5c + (ulong)uVar6 * 4)))
                          (&DAT_00a5ed5c,&DAT_00a5ed5c + *(int *)(&DAT_00a5ed5c + (ulong)uVar6 * 4))
                ;
                return;
              }
              if ((uVar4 < 0x1000000000) || (uVar7 = *(uint *)((long)puVar15 + 0xc), uVar7 == 0))
              goto LAB_00865193;
              uVar10 = *(uint *)(*(long *)(lVar13 + (long)((int)uVar7 >> 0xd) * 8) +
                                (ulong)(uVar7 & 0x1ffe) * 8) >> 0x1e;
              if ((uVar7 & 1) != 0) {
                (*(code *)(&DAT_00a5ed6c + *(int *)(&DAT_00a5ed6c + (ulong)uVar10 * 4)))
                          (&DAT_00a5ed6c,&DAT_00a5ed6c + *(int *)(&DAT_00a5ed6c + (ulong)uVar10 * 4)
                          );
                return;
              }
              uVar8 = 0x80000000;
              if ((uVar10 != 1) != (uVar6 == 1)) {
                uVar8 = 0x40000000;
              }
              if (uVar10 == 3) {
                uVar8 = 0xc0000000;
              }
              if (uVar6 == 3) {
                uVar8 = 0xc0000000;
              }
            }
            else {
              if (uVar6 != 1) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                              ,0x54c,"void Au_NtkTerSimulate_rec(Au_Ntk_t *)");
              }
              if ((uVar4 < 0x800000000) || (uVar7 = (uint)puVar15[1], uVar7 == 0))
              goto LAB_00865193;
              lVar13 = *(long *)(*(long *)((ulong)puVar15 & 0xfffffffffffffc00) + 0x78);
              uVar6 = *(uint *)(*(long *)(lVar13 + (long)((int)uVar7 >> 0xd) * 8) +
                               (ulong)(uVar7 & 0x1ffe) * 8) >> 0x1e;
              if ((uVar7 & 1) != 0) {
                (*(code *)(&DAT_00a5ed7c + *(int *)(&DAT_00a5ed7c + (ulong)uVar6 * 4)))
                          (&DAT_00a5ed7c,&DAT_00a5ed7c + *(int *)(&DAT_00a5ed7c + (ulong)uVar6 * 4))
                ;
                return;
              }
              if ((uVar4 < 0x1000000000) || (uVar7 = *(uint *)((long)puVar15 + 0xc), uVar7 == 0))
              goto LAB_00865193;
              uVar10 = *(uint *)(*(long *)(lVar13 + (long)((int)uVar7 >> 0xd) * 8) +
                                (ulong)(uVar7 & 0x1ffe) * 8) >> 0x1e;
              if ((uVar7 & 1) != 0) {
                (*(code *)(&DAT_00a5ed8c + *(int *)(&DAT_00a5ed8c + (ulong)uVar10 * 4)))
                          (&DAT_00a5ed8c,&DAT_00a5ed8c + *(int *)(&DAT_00a5ed8c + (ulong)uVar10 * 4)
                          );
                return;
              }
              uVar8 = 0x40000000;
              if ((((uVar6 != 1) && (uVar10 != 1)) && (uVar8 = 0xc0000000, uVar6 != 3)) &&
                 (uVar10 != 3)) {
                if ((uVar6 != 2) || (uVar10 != 2)) {
                  __assert_fail("Value0 == AU_VAL1 && Value1 == AU_VAL1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                                ,0x4fb,"int Au_XsimAnd(int, int)");
                }
                uVar8 = 0x80000000;
              }
            }
            uVar8 = uVar4 & 0xffffffff3fffffff | uVar8;
          }
LAB_00864f8c:
          *puVar15 = uVar8;
        }
        else if (uVar8 == 0x600000000) {
          lVar13 = *(long *)(*(long *)((ulong)puVar15 & 0xfffffffffffffc00) + 8);
          if (*(int *)(lVar13 + 0xc) <= (int)(uVar6 & 0x3fffffff)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          p_00 = *(Au_Ntk_t **)(*(long *)(lVar13 + 0x10) + (ulong)(uVar6 & 0x3fffffff) * 8);
          if (p_00->nObjs[2] != uVar7 >> 3) {
            __assert_fail("Au_ObjFaninNum(pObj) == Au_NtkPiNum(pModel)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                          ,0x552,"void Au_NtkTerSimulate_rec(Au_Ntk_t *)");
          }
          if (*(int *)((long)puVar15 + (uVar4 >> 0x23) * 4 + 8) != p_00->nObjs[3]) {
            __assert_fail("Au_BoxFanoutNum(pObj) == Au_NtkPoNum(pModel)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                          ,0x553,"void Au_NtkTerSimulate_rec(Au_Ntk_t *)");
          }
          lVar13 = -(ulong)((uint)puVar15 & 0x3ff);
          if (0x7ffffffff < *puVar15) {
            uVar4 = 0;
            do {
              uVar7 = *(uint *)((long)puVar15 + uVar4 * 4 + 8);
              if (uVar7 == 0) goto LAB_00865193;
              if ((long)(p_00->vPis).nSize <= (long)uVar4) goto LAB_00865174;
              uVar6 = (p_00->vPis).pArray[uVar4];
              pvVar1 = (p_00->vPages).pArray[(int)uVar6 >> 0xc];
              uVar8 = (ulong)((uVar6 & 0xfff) << 4);
              *(ulong *)((long)pvVar1 + uVar8) =
                   *(ulong *)((long)pvVar1 + uVar8) & 0xffffffff3fffffff |
                   (ulong)((uint)*(undefined8 *)
                                  (*(long *)(*(long *)(*(long *)((long)puVar15 + lVar13) + 0x78) +
                                            (long)((int)uVar7 >> 0xd) * 8) +
                                  (ulong)(uVar7 & 0x1ffe) * 8) & 0xc0000000);
              uVar4 = uVar4 + 1;
            } while (uVar4 < *puVar15 >> 0x23);
          }
          Au_NtkTerSimulate_rec(p_00);
          uVar4 = *puVar15;
          if ((uVar4 & 0x700000000) != 0x600000000) {
LAB_008651b2:
            __assert_fail("Au_ObjIsBox(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                          ,0xb5,"int Au_BoxFanoutNum(Au_Obj_t *)");
          }
          lVar9 = 0;
          while (lVar9 < *(int *)((long)puVar15 + (uVar4 >> 0x23) * 4 + 8)) {
            if ((p_00->vPos).nSize <= lVar9) goto LAB_00865174;
            lVar5 = (uVar4 >> 0x23) + lVar9;
            uVar7 = (p_00->vPos).pArray[lVar9];
            lVar9 = lVar9 + 1;
            uVar6 = *(uint *)((long)puVar15 + lVar5 * 4 + 0xc);
            lVar5 = *(long *)(*(long *)(*(long *)((long)puVar15 + lVar13) + 0x78) +
                             (long)((int)uVar6 >> 0xc) * 8);
            uVar4 = (ulong)((uVar6 & 0xfff) << 4);
            *(ulong *)(lVar5 + uVar4) =
                 *(ulong *)(lVar5 + uVar4) & 0xffffffff3fffffff |
                 (ulong)((uint)*(undefined8 *)
                                ((long)(p_00->vPages).pArray[(int)uVar7 >> 0xc] +
                                (ulong)((uVar7 & 0xfff) << 4)) & 0xc0000000);
            uVar4 = *puVar15;
            if ((uVar4 & 0x700000000) != 0x600000000) goto LAB_008651b2;
          }
        }
        else if (uVar8 == 0x100000000) {
          uVar8 = uVar4 & 0xfffffff93fffffff | 0x40000000;
          goto LAB_00864f8c;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < (p->vObjs).nSize);
    }
    iVar2 = (p->vPos).nSize;
    if (0 < iVar2) {
      lVar14 = 0;
      do {
        if ((p->vPos).nSize <= lVar14) goto LAB_00865174;
        if ((*puVar15 < 0x800000000) || (uVar7 = (uint)puVar15[1], uVar7 == 0)) {
LAB_00865193:
          __assert_fail("i >= 0 && i < (int)p->nFanins && p->Fanins[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                        ,0xa5,"int Au_ObjFaninId(Au_Obj_t *, int)");
        }
        uVar6 = (p->vPos).pArray[lVar14];
        puVar12 = (ulong *)((ulong)((uVar6 & 0xfff) << 4) +
                           (long)(p->vPages).pArray[(int)uVar6 >> 0xc]);
        uVar6 = *(uint *)(*(long *)(*(long *)(*(long *)((long)puVar15 -
                                                       (ulong)((uint)puVar15 & 0x3ff)) + 0x78) +
                                   (long)((int)uVar7 >> 0xd) * 8) + (ulong)(uVar7 & 0x1ffe) * 8) >>
                0x1e;
        if ((uVar7 & 1) != 0) {
          (*(code *)(&DAT_00a5ed9c + *(int *)(&DAT_00a5ed9c + (ulong)uVar6 * 4)))
                    (&DAT_00a5ed9c + *(int *)(&DAT_00a5ed9c + (ulong)uVar6 * 4));
          return;
        }
        *puVar12 = *puVar12 & 0xffffffff3fffffff | (ulong)(uVar6 << 0x1e);
        lVar14 = lVar14 + 1;
        iVar2 = (p->vPos).nSize;
      } while (lVar14 < iVar2);
    }
    if (0 < iVar2) {
      iVar3 = (p->vPos).nSize;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      if (iVar3 != 0) {
        uVar7 = *(p->vPos).pArray;
        (*(code *)(&DAT_00a5edac +
                  *(int *)(&DAT_00a5edac +
                          (ulong)(*(uint *)((long)(p->vPages).pArray[(int)uVar7 >> 0xc] +
                                           (ulong)((uVar7 & 0xfff) << 4)) >> 0x1e) * 4)))
                  (0x3ff0000000000000,
                   &DAT_00a5edac +
                   *(int *)(&DAT_00a5edac +
                           (ulong)(*(uint *)((long)(p->vPages).pArray[(int)uVar7 >> 0xc] +
                                            (ulong)((uVar7 & 0xfff) << 4)) >> 0x1e) * 4),
                   &DAT_00a5edac,iVar2);
        return;
      }
      goto LAB_00865174;
    }
  }
  return;
}

Assistant:

void Au_NtkTerSimulate_rec( Au_Ntk_t * p )
{ 
    Au_Obj_t * pObj = NULL, * pTerm;
    int i, k;
    Au_NtkForEachPi( p, pTerm, i )
    {
        assert( Au_ObjGetXsim(pTerm) > 0 );
        if ( Au_ObjGetXsim(pTerm) == AU_VALX )
            p->pMan->nPortsNC++;
        else if ( Au_ObjGetXsim(pTerm) == AU_VAL0 )
            p->pMan->nPortsC0++;
        else
            p->pMan->nPortsC1++;
    }
    if ( strcmp(Au_NtkName(p), "ref_egcd") == 0 )
    {
        printf( "Replacing one instance of recursive model \"%s\" by a black box.\n", "ref_egcd" );
        Au_NtkForEachPo( p, pTerm, i )
            Au_ObjSetXsim( pTerm, AU_VALX );
        return;
    }
    Au_NtkForEachObj( p, pObj, i )
    {
        if ( Au_ObjIsNode(pObj) )
        {
            if ( pObj->Func == 1 )
                Au_ObjSetXsim( pObj, Au_XsimAnd(Au_ObjGetXsimFan0(pObj), Au_ObjGetXsimFan1(pObj)) );
            else if ( pObj->Func == 2 )
                Au_ObjSetXsim( pObj, Au_XsimXor(Au_ObjGetXsimFan0(pObj), Au_ObjGetXsimFan1(pObj)) );
            else if ( pObj->Func == 3 )
                Au_ObjSetXsim( pObj, Au_XsimMux(Au_ObjGetXsimFan0(pObj), Au_ObjGetXsimFan1(pObj), Au_ObjGetXsimFan2(pObj)) );
            else assert( 0 );
        }
        else if ( Au_ObjIsBox(pObj) )
        {
            Au_Ntk_t * pModel = Au_ObjModel(pObj);
            // check the match between the number of actual and formal parameters
            assert( Au_ObjFaninNum(pObj) == Au_NtkPiNum(pModel) );
            assert( Au_BoxFanoutNum(pObj) == Au_NtkPoNum(pModel) );
            // assign PIs
            Au_ObjForEachFanin( pObj, pTerm, k )
                Au_ObjSetXsim( Au_NtkPi(pModel, k), Au_ObjGetXsim(pTerm) );
            // call recursively
            Au_NtkTerSimulate_rec( pModel );
            // assign POs
            Au_BoxForEachFanout( pObj, pTerm, k )
                Au_ObjSetXsim( pTerm, Au_ObjGetXsim(Au_NtkPo(pModel, k)) );
        }
        else if ( Au_ObjIsConst0(pObj) )
            Au_ObjSetXsim( pObj, AU_VAL0 );
            
    }
    Au_NtkForEachPo( p, pTerm, i )
        Au_ObjSetXsim( pTerm, Au_ObjGetXsimFan0(pObj) );
    Au_NtkForEachPo( p, pTerm, i )
    {
        assert( Au_ObjGetXsim(pTerm) > 0 );
        if ( Au_ObjGetXsim(pTerm) == AU_VALX )
            p->pMan->nPortsNC++;
        else if ( Au_ObjGetXsim(pTerm) == AU_VAL0 )
            p->pMan->nPortsC0++;
        else
            p->pMan->nPortsC1++;
    }
}